

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* Program::create(Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *__return_storage_ptr__,string *fragment_src,string *vertex_src)

{
  bool bVar1;
  GLuint GVar2;
  GLuint GVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  Shader *pSVar6;
  Program local_9ec;
  string local_9e8;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9c8;
  undefined1 local_9a8 [8];
  char info [2048];
  undefined4 local_1a0;
  int local_19c;
  GLsizei length;
  GLint linked;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined1 local_158 [8];
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fragment_result;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  undefined1 local_f0 [8];
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  vertex_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined4 local_80;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Handle local_24;
  string *psStack_20;
  Handle handle;
  string *vertex_src_local;
  string *fragment_src_local;
  
  psStack_20 = vertex_src;
  GVar2 = glCreateProgram();
  Handle::Handle(&local_24,GVar2);
  GVar2 = Handle::name(&local_24);
  if (GVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Cannot create program",&local_79);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_58,&local_78);
    Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_58);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    local_80 = 1;
  }
  else {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        anon_unknown.dwarf_629e3::Shader::create
                  ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_f0,0x8b31,psStack_20);
        bVar1 = Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::hasValue((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_f0);
        if (bVar1) {
          anon_unknown.dwarf_629e3::Shader::create
                    ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_158,0x8b30,fragment_src);
          bVar1 = Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::hasValue((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_158);
          if (bVar1) {
            GVar2 = Handle::name(&local_24);
            pSVar6 = Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator->((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_f0);
            GVar3 = anon_unknown.dwarf_629e3::Shader::name(pSVar6);
            glAttachShader(GVar2,GVar3);
            GVar2 = Handle::name(&local_24);
            pSVar6 = Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator->((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_158);
            GVar3 = anon_unknown.dwarf_629e3::Shader::name(pSVar6);
            glAttachShader(GVar2,GVar3);
            GVar2 = Handle::name(&local_24);
            glLinkProgram(GVar2);
            local_19c = 0;
            GVar2 = Handle::name(&local_24);
            glGetProgramiv(GVar2,0x8b82,&local_19c);
            if (local_19c == 1) {
              GVar2 = Handle::name(&local_24);
              aAppDebugPrintf("Built program %u",(ulong)GVar2);
              Program(&local_9ec,&local_24);
              Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(__return_storage_ptr__,&local_9ec);
              ~Program(&local_9ec);
            }
            else {
              local_1a0 = 0;
              GVar2 = Handle::name(&local_24);
              glGetProgramInfoLog(GVar2,0x800,&local_1a0,local_9a8);
              format_abi_cxx11_(&local_9e8,"Program link error: %s",local_9a8);
              Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Unexpected(&local_9c8,&local_9e8);
              Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(__return_storage_ptr__,&local_9c8);
              Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Unexpected(&local_9c8);
              std::__cxx11::string::~string((string *)&local_9e8);
            }
          }
          else {
            pbVar5 = Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_158);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &length,"Cannot compile fragment shader: ",pbVar5);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Unexpected(&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &length);
            Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,&local_178);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Unexpected(&local_178);
            std::__cxx11::string::~string((string *)&length);
          }
          local_80 = 1;
          Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_158);
        }
        else {
          pbVar5 = Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::error((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_f0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fragment_result.has_value_,"Cannot compile vertex shader: ",pbVar5);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Unexpected(&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fragment_result.has_value_);
          Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,&local_110);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Unexpected(&local_110);
          std::__cxx11::string::~string((string *)&fragment_result.has_value_);
          local_80 = 1;
        }
        Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_f0);
        goto LAB_00145695;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Empty shader sources",
               (allocator<char> *)&vertex_result.field_0x27);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_a0,&local_c0);
    Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_a0);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&vertex_result.field_0x27);
    local_80 = 1;
  }
LAB_00145695:
  Handle::~Handle(&local_24);
  return __return_storage_ptr__;
}

Assistant:

Expected<Program,std::string> Program::create(const std::string& fragment_src, const std::string &vertex_src) {
	Handle handle(glCreateProgram());
	if (!handle.name())
		return Unexpected(std::string("Cannot create program"));

	if (vertex_src.empty() || fragment_src.empty())
		return Unexpected(std::string("Empty shader sources"));

	auto vertex_result = Shader::create(GL_VERTEX_SHADER, vertex_src);
	if (!vertex_result.hasValue())
		return Unexpected("Cannot compile vertex shader: " + vertex_result.error());

	auto fragment_result = Shader::create(GL_FRAGMENT_SHADER, fragment_src);
	if (!fragment_result.hasValue())
		return Unexpected("Cannot compile fragment shader: " + fragment_result.error());

	glAttachShader(handle.name(), vertex_result->name());
	glAttachShader(handle.name(), fragment_result->name());

	glLinkProgram(handle.name());

	GLint linked = GL_FALSE;
	glGetProgramiv(handle.name(), GL_LINK_STATUS, &linked);
	if (linked != GL_TRUE) {
		GLsizei length = 0;
		char info[2048];
		glGetProgramInfoLog(handle.name(), COUNTOF(info), &length, info);
		return Unexpected(format("Program link error: %s", info));
	}

	MSG("Built program %u", handle.name());
	return Program(std::move(handle));
}